

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Gla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **__s;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  int v;
  char *local_d8;
  Vec_Int_t *vStatuses;
  Abs_Par_t Pars;
  Vec_Ptr_t *vSeqModelVec;
  
  Abs_ParSetDefaults(&Pars);
  local_d8 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar2 = true;
LAB_0026096e:
  iVar3 = Extra_UtilGetopt(argc,argv,"FSCMDETRQPBALtfardmnscbpquwvh");
  iVar4 = globalUtilOptind;
  pcVar9 = "Command line switch \"-P\" should be followed by an integer.\n";
  switch(iVar3) {
  case 0x41:
    if (globalUtilOptind < argc) {
      Pars.pFileVabs = argv[globalUtilOptind];
LAB_00260b2a:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0026096e;
    }
    pcVar9 = "Command line switch \"-A\" should be followed by a file name.\n";
    break;
  case 0x42:
    if (argc <= globalUtilOptind) {
      pcVar9 = "Command line switch \"-B\" should be followed by an integer.\n";
      break;
    }
    iVar3 = atoi(argv[globalUtilOptind]);
    Pars.nFramesNoChangeLim = iVar3;
LAB_00260bbc:
    globalUtilOptind = iVar4 + 1;
    if (iVar3 < 0) {
switchD_00260996_caseD_47:
      Abc_Print(-2,"usage: &gla [-FSCMDETRQPB num] [-AL file] [-fardmnscbpquwvh]\n");
      Abc_Print(-2,"\t          fixed-time-frame gate-level proof- and cex-based abstraction\n");
      Abc_Print(-2,"\t-F num  : the max number of timeframes to unroll [default = %d]\n",
                (ulong)(uint)Pars.nFramesMax);
      Abc_Print(-2,"\t-S num  : the starting time frame (0=unused) [default = %d]\n",
                (ulong)(uint)Pars.nFramesStart);
      Abc_Print(-2,"\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n",
                (ulong)(uint)Pars.nConfLimit);
      Abc_Print(-2,
                "\t-M num  : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)Pars.nLearnedStart);
      Abc_Print(-2,"\t-D num  : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)Pars.nLearnedDelta);
      Abc_Print(-2,"\t-E num  : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)(uint)Pars.nLearnedPerce);
      Abc_Print(-2,"\t-T num  : an approximate timeout, in seconds [default = %d]\n",
                (ulong)(uint)Pars.nTimeOut);
      Abc_Print(-2,
                "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)Pars.nRatioMin);
      Abc_Print(-2,
                "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)Pars.nRatioMin2);
      Abc_Print(-2,
                "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)Pars.nRatioMax);
      Abc_Print(-2,
                "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n"
                ,(ulong)(uint)Pars.nFramesNoChangeLim);
      Abc_Print(-2,
                "\t-A file : file name for dumping abstrated model (&gla -d) or abstraction map (&gla -m)\n"
               );
      pcVar9 = "no logging";
      if (local_d8 != (char *)0x0) {
        pcVar9 = local_d8;
      }
      Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar9);
      pcVar8 = "yes";
      pcVar9 = "yes";
      if (Pars.fPropFanout == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-f      : toggle propagating fanout implications [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (Pars.fAddLayer == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-a      : toggle refinement by adding one layers of gates [default = %s]\n",
                pcVar9);
      pcVar9 = "yes";
      if (Pars.fNewRefine == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-r      : toggle using improved refinement heuristics [default = %s]\n",pcVar9
               );
      pcVar9 = "yes";
      if (Pars.fDumpVabs == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-d      : toggle dumping abstracted model into a file [default = %s]\n",pcVar9
               );
      pcVar9 = "yes";
      if (Pars.fDumpMabs == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-m      : toggle dumping abstraction map into a file [default = %s]\n",pcVar9)
      ;
      pcVar9 = "yes";
      if (!bVar2) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-n      : toggle using new algorithms [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (Pars.fUseSkip == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-s      : toggle skipping previously proved timeframes [default = %s]\n",
                pcVar9);
      pcVar9 = "yes";
      if (Pars.fUseSimple == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n"
                ,pcVar9);
      pcVar9 = "yes";
      if (Pars.fSkipHash == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-b      : toggle CNF construction without hashing [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (Pars.fUseFullProof == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (Pars.fCallProver == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-q      : toggle calling the prover [default = %s]\n",pcVar9);
      pcVar9 = "yes";
      if (Pars.fSimpProver == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,
                "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n"
                ,pcVar9);
      pcVar9 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar9);
      if (Pars.fVeryVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-w      : toggle printing more verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
    goto LAB_0026096e;
  case 0x43:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nConfLimit = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nLearnedDelta = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nLearnedPerce = iVar3;
      goto LAB_00260bbc;
    }
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nFramesMax = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6f:
    goto switchD_00260996_caseD_47;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_d8 = argv[globalUtilOptind];
      goto LAB_00260b2a;
    }
    pcVar9 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4d:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nLearnedStart = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-M\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nRatioMax = iVar3;
      goto LAB_00260bbc;
    }
    break;
  case 0x51:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nRatioMin2 = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nRatioMin = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nFramesStart = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOut = iVar3;
      goto LAB_00260bbc;
    }
    pcVar9 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x61:
    Pars.fAddLayer = Pars.fAddLayer ^ 1;
    goto LAB_0026096e;
  case 0x62:
    Pars.fSkipHash = Pars.fSkipHash ^ 1;
    goto LAB_0026096e;
  case 99:
    Pars.fUseSimple = Pars.fUseSimple ^ 1;
    goto LAB_0026096e;
  case 100:
    Pars.fDumpVabs = Pars.fDumpVabs ^ 1;
    goto LAB_0026096e;
  case 0x66:
    Pars.fPropFanout = Pars.fPropFanout ^ 1;
    goto LAB_0026096e;
  case 0x6d:
    Pars.fDumpMabs = Pars.fDumpMabs ^ 1;
    goto LAB_0026096e;
  case 0x6e:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0026096e;
  case 0x70:
    Pars.fUseFullProof = Pars.fUseFullProof ^ 1;
    goto LAB_0026096e;
  case 0x71:
    Pars.fCallProver = Pars.fCallProver ^ 1;
    goto LAB_0026096e;
  case 0x72:
    Pars.fNewRefine = Pars.fNewRefine ^ 1;
    goto LAB_0026096e;
  case 0x73:
    Pars.fUseSkip = Pars.fUseSkip ^ 1;
    goto LAB_0026096e;
  case 0x74:
    Pars.fUseTermVars._0_1_ = (byte)Pars.fUseTermVars ^ 1;
    goto LAB_0026096e;
  case 0x75:
    Pars.fSimpProver = Pars.fSimpProver ^ 1;
    goto LAB_0026096e;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_0026096e;
  case 0x77:
    Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
    goto LAB_0026096e;
  default:
    if (iVar3 == -1) {
      pGVar7 = pAbc->pGia;
      if (pGVar7 == (Gia_Man_t *)0x0) {
        pcVar9 = "There is no AIG.\n";
        iVar4 = -1;
      }
      else {
        if (Pars.nFramesMax < 0) {
          pcVar9 = "The number of starting frames should be a positive integer.\n";
        }
        else {
          if ((Pars.nFramesMax == 0) || (Pars.nFramesStart <= Pars.nFramesMax)) {
            lVar10 = (long)pGVar7->vCos->nSize - (long)pGVar7->nRegs;
            iVar4 = (int)lVar10;
            if (iVar4 == 1) {
              if (bVar2) {
                iVar4 = Gia_ManPerformGla(pGVar7,&Pars);
              }
              else {
                iVar4 = Gia_ManPerformGlaOld(pGVar7,&Pars,0);
              }
              pAbc->Status = iVar4;
              pAbc->nFrames = Pars.iFrame;
              Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
              if (local_d8 == (char *)0x0) {
                return 0;
              }
              Abc_NtkWriteLogFile(local_d8,pAbc->pCex,pAbc->Status,pAbc->nFrames,"&gla");
              return 0;
            }
            pVVar5 = (Vec_Ptr_t *)malloc(0x10);
            lVar1 = 8;
            if (6 < iVar4 - 1U) {
              lVar1 = lVar10;
            }
            iVar3 = (int)lVar1;
            pVVar5->nCap = iVar3;
            v = 0;
            if (iVar3 == 0) {
              __s = (void **)0x0;
            }
            else {
              __s = (void **)malloc((long)iVar3 << 3);
            }
            pVVar5->pArray = __s;
            pVVar5->nSize = iVar4;
            memset(__s,0,lVar10 * 8);
            vSeqModelVec = pVVar5;
            vStatuses = Vec_IntAlloc(iVar4);
            goto LAB_002610e2;
          }
          pcVar9 = "The starting frame is larger than the max number of frames.\n";
        }
        iVar4 = 1;
      }
      Abc_Print(iVar4,pcVar9);
      return 0;
    }
    goto switchD_00260996_caseD_47;
  }
  Abc_Print(-1,pcVar9);
  goto switchD_00260996_caseD_47;
LAB_002610e2:
  pGVar7 = pAbc->pGia;
  iVar4 = pGVar7->vCos->nSize - pGVar7->nRegs;
  if (iVar4 <= v) {
LAB_002611b8:
    if (vStatuses->nSize == iVar4) {
      Abc_FrameReplaceCexVec(pAbc,&vSeqModelVec);
      Abc_FrameReplacePoStatuses(pAbc,&vStatuses);
      pAbc->nFrames = -1;
      return 0;
    }
    __assert_fail("Vec_IntSize(vStatuses) == Gia_ManPoNum(pAbc->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                  ,0xb903,"int Abc_CommandAbc9Gla(Abc_Frame_t *, int, char **)");
  }
  pGVar6 = Gia_ManCo(pGVar7,v);
  pGVar7 = pAbc->pGia;
  if (pGVar6 == (Gia_Obj_t *)0x0) {
    iVar4 = pGVar7->vCos->nSize - pGVar7->nRegs;
    goto LAB_002611b8;
  }
  pGVar7 = Gia_ManDupDfsOnePo(pGVar7,v);
  if (bVar2) {
    iVar4 = Gia_ManPerformGla(pGVar7,&Pars);
  }
  else {
    iVar4 = Gia_ManPerformGlaOld(pGVar7,&Pars,0);
  }
  Vec_IntPush(vStatuses,iVar4);
  if (local_d8 != (char *)0x0) {
    Abc_NtkWriteLogFile(local_d8,pGVar7->pCexSeq,iVar4,Pars.iFrame,"&gla");
  }
  if (pGVar7->pCexSeq != (Abc_Cex_t *)0x0) {
    Vec_PtrWriteEntry(vSeqModelVec,v,pGVar7->pCexSeq);
  }
  pGVar7->pCexSeq = (Abc_Cex_t *)0x0;
  Gia_ManStop(pGVar7);
  v = v + 1;
  goto LAB_002610e2;
}

Assistant:

int Abc_CommandAbc9Gla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abs_Par_t Pars, * pPars = &Pars;
    int c, fNewAlgo = 1;
    char * pLogFileName = NULL;
    Abs_ParSetDefaults( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FSCMDETRQPBALtfardmnscbpquwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesStart < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin2 < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMax < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesNoChangeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesNoChangeLim < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFileVabs = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 't':
            pPars->fUseTermVars ^= 1;
            break;
        case 'f':
            pPars->fPropFanout ^= 1;
            break;
        case 'a':
            pPars->fAddLayer ^= 1;
            break;
        case 'r':
            pPars->fNewRefine ^= 1;
            break;
        case 'd':
            pPars->fDumpVabs ^= 1;
            break;
        case 'm':
            pPars->fDumpMabs ^= 1;
            break;
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 's':
            pPars->fUseSkip ^= 1;
            break;
        case 'c':
            pPars->fUseSimple ^= 1;
            break;
        case 'b':
            pPars->fSkipHash ^= 1;
            break;
        case 'p':
            pPars->fUseFullProof ^= 1;
            break;
        case 'q':
            pPars->fCallProver ^= 1;
            break;
        case 'u':
            pPars->fSimpProver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no AIG.\n" );
        return 0;
    }
/*
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
*/
    if ( pPars->nFramesMax < 0 )
    {
        Abc_Print( 1, "The number of starting frames should be a positive integer.\n" );
        return 0;
    }
    if ( pPars->nFramesMax && pPars->nFramesStart > pPars->nFramesMax )
    {
        Abc_Print( 1, "The starting frame is larger than the max number of frames.\n" );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        if ( fNewAlgo )
            pAbc->Status = Gia_ManPerformGla( pAbc->pGia, pPars );
        else
            pAbc->Status  = Gia_ManPerformGlaOld( pAbc->pGia, pPars, 0 );
        pAbc->nFrames = pPars->iFrame;
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
        if ( pLogFileName )
            Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&gla" );
    }
    else // iterate over outputs
    {
        Gia_Obj_t * pObj; int o, Status;
        Vec_Ptr_t * vSeqModelVec = Vec_PtrStart( Gia_ManPoNum(pAbc->pGia) );
        Vec_Int_t * vStatuses = Vec_IntAlloc( Gia_ManPoNum(pAbc->pGia) );
        Gia_ManForEachPo( pAbc->pGia, pObj, o )
        {
            Gia_Man_t * pOne = Gia_ManDupDfsOnePo( pAbc->pGia, o );
            if ( fNewAlgo )
                Status = Gia_ManPerformGla( pOne, pPars );
            else
                Status = Gia_ManPerformGlaOld( pOne, pPars, 0 );
            Vec_IntPush( vStatuses, Status );
            if ( pLogFileName )
                Abc_NtkWriteLogFile( pLogFileName, pOne->pCexSeq, Status, pPars->iFrame, "&gla" );
            if ( pOne->pCexSeq )
                Vec_PtrWriteEntry( vSeqModelVec, o, pOne->pCexSeq );
            pOne->pCexSeq = NULL;
            Gia_ManStop( pOne );
        }
        assert( Vec_IntSize(vStatuses) == Gia_ManPoNum(pAbc->pGia) );
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
        Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
        pAbc->nFrames = -1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &gla [-FSCMDETRQPB num] [-AL file] [-fardmnscbpquwvh]\n" );
    Abc_Print( -2, "\t          fixed-time-frame gate-level proof- and cex-based abstraction\n" );
    Abc_Print( -2, "\t-F num  : the max number of timeframes to unroll [default = %d]\n", pPars->nFramesMax );
    Abc_Print( -2, "\t-S num  : the starting time frame (0=unused) [default = %d]\n", pPars->nFramesStart );
    Abc_Print( -2, "\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n", pPars->nConfLimit );
    Abc_Print( -2, "\t-M num  : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-D num  : delta value for learned clause removal [default = %d]\n", pPars->nLearnedDelta );
    Abc_Print( -2, "\t-E num  : ratio percentage for learned clause removal [default = %d]\n", pPars->nLearnedPerce );
    Abc_Print( -2, "\t-T num  : an approximate timeout, in seconds [default = %d]\n", pPars->nTimeOut );
    Abc_Print( -2, "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n", pPars->nRatioMin );
    Abc_Print( -2, "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n", pPars->nRatioMin2 );
    Abc_Print( -2, "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n", pPars->nRatioMax );
    Abc_Print( -2, "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n", pPars->nFramesNoChangeLim );
    Abc_Print( -2, "\t-A file : file name for dumping abstrated model (&gla -d) or abstraction map (&gla -m)\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-f      : toggle propagating fanout implications [default = %s]\n", pPars->fPropFanout? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle refinement by adding one layers of gates [default = %s]\n", pPars->fAddLayer? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle using improved refinement heuristics [default = %s]\n", pPars->fNewRefine? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping abstracted model into a file [default = %s]\n", pPars->fDumpVabs? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle dumping abstraction map into a file [default = %s]\n", pPars->fDumpMabs? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle using new algorithms [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle skipping previously proved timeframes [default = %s]\n", pPars->fUseSkip? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n", pPars->fUseSimple? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggle CNF construction without hashing [default = %s]\n", pPars->fSkipHash? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n", pPars->fUseFullProof? "yes": "no" );
    Abc_Print( -2, "\t-q      : toggle calling the prover [default = %s]\n", pPars->fCallProver? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n", pPars->fSimpProver? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w      : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}